

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O0

string * __thiscall XmlRpc::XmlRpcValue::binaryToXml_abi_cxx11_(XmlRpcValue *this)

{
  size_type raw_size;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Encoder encoder;
  size_t offset;
  string *xml;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_12;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::allocator<char>::~allocator(&local_12);
  std::__cxx11::string::operator+=((string *)in_RDI,BASE64_TAG);
  std::__cxx11::string::size();
  std::__cxx11::string::size();
  raw_size = std::vector<char,_std::allocator<char>_>::size
                       (*(vector<char,_std::allocator<char>_> **)(in_RSI + 8));
  anon_unknown_3::base64EncodedSize(raw_size);
  std::__cxx11::string::resize((ulong)in_RDI);
  base64::Encoder::Encoder
            ((Encoder *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff5c);
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x56de09);
  std::vector<char,_std::allocator<char>_>::size
            (*(vector<char,_std::allocator<char>_> **)(in_RSI + 8));
  std::__cxx11::string::operator[]((ulong)in_RDI);
  base64::Encoder::encode
            ((Encoder *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
             (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::__cxx11::string::operator[]((ulong)in_RDI);
  base64::Encoder::encode_end
            ((Encoder *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::__cxx11::string::resize((ulong)in_RDI);
  std::__cxx11::string::operator+=((string *)in_RDI,"</base64>");
  std::__cxx11::string::operator+=((string *)in_RDI,"</value>");
  return this_00;
}

Assistant:

std::string XmlRpcValue::binaryToXml() const
  {
    // Wrap with xml
    std::string xml = VALUE_TAG;
    xml += BASE64_TAG;

    std::size_t offset = xml.size();
    // might reserve too much, we'll shrink later
    xml.resize(xml.size() + base64EncodedSize(_value.asBinary->size()));

    base64::Encoder encoder;
    offset += encoder.encode(_value.asBinary->data(), _value.asBinary->size(), &xml[offset]);
    offset += encoder.encode_end(&xml[offset]);
    xml.resize(offset);

    xml += BASE64_ETAG;
    xml += VALUE_ETAG;
    return xml;
  }